

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

error_code anon_unknown.dwarf_522f::path_max(size_t *result)

{
  int val;
  int *piVar1;
  long lVar2;
  error_category *cat;
  error_code eVar3;
  long tmp;
  size_t *result_local;
  error_category *local_10;
  
  if (path_max::max == 0) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar2 = pathconf("/",3);
    if (lVar2 < 0) {
      piVar1 = __errno_location();
      if (*piVar1 != 0) {
        piVar1 = __errno_location();
        val = *piVar1;
        cat = boost::system::system_category();
        boost::system::error_code::error_code((error_code *)&result_local,val,cat);
        goto LAB_0011680b;
      }
      path_max::max = 0x1000;
    }
    else {
      path_max::max = lVar2 + 1;
    }
  }
  *result = path_max::max;
  result_local = (anonymous_namespace)::ok;
  local_10 = DAT_00129410;
LAB_0011680b:
  eVar3._0_8_ = (ulong)result_local & 0xffffffff;
  eVar3.m_cat = local_10;
  return eVar3;
}

Assistant:

error_code path_max(std::size_t & result)
  // this code is based on Stevens and Rago, Advanced Programming in the
  // UNIX envirnment, 2nd Ed., ISBN 0-201-43307-9, page 49
  {
#   ifdef PATH_MAX
    static std::size_t max = PATH_MAX;
#   else
    static std::size_t max = 0;
#   endif
    if (max == 0)
    {
      errno = 0;
      long tmp = ::pathconf("/", _PC_NAME_MAX);
      if (tmp < 0)
      {
        if (errno == 0)// indeterminate
          max = 4096; // guess
        else return error_code(errno, system_category());
      }
      else max = static_cast<std::size_t>(tmp + 1); // relative root
    }
    result = max;
    return ok;
  }